

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_tool.c
# Opt level: O0

int check_need_raw_data(void)

{
  int local_14;
  int local_10;
  int j;
  int i;
  
  if (((need_output == 0) && (need_report == 0)) && (need_identify == 0)) {
    for (local_10 = 0; local_10 < num_requests; local_10 = local_10 + 1) {
      for (local_14 = 0; local_14 < 0x32; local_14 = local_14 + 1) {
        if ((requests[local_10] == matchtable[local_14].sw) &&
           (matchtable[local_14].ident_required != 0)) {
          return 1;
        }
      }
    }
    j = 0;
  }
  else {
    j = 1;
  }
  return j;
}

Assistant:

static int check_need_raw_data(void)
{
	int i, j;

	if (need_output || need_report || need_identify) return 1;
	for (i = 0; i < num_requests; i++) {
		for (j = 0; j < sz_match; j++)
			if (requests[i] == matchtable[j].sw &&
			    matchtable[j].ident_required) return 1;
	}
	return 0;
}